

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

long64 ClipperLib::TopX(IntPoint pt1,IntPoint pt2,long64 currentY)

{
  long lVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  
  lVar1 = pt1.Y;
  lVar2 = pt1.X;
  if (currentY < lVar1) {
    if (currentY == pt2.Y) {
      return pt2.X;
    }
    lVar3 = lVar2 - pt2.X;
    if (lVar3 != 0) {
      dVar4 = (double)(currentY - lVar1) * ((double)lVar3 / (double)(lVar1 - pt2.Y)) + (double)lVar2
      ;
      return (long)(dVar4 + *(double *)(&DAT_007684b0 + (ulong)(dVar4 < 0.0) * 8));
    }
  }
  return lVar2;
}

Assistant:

long64 TopX(const IntPoint pt1, const IntPoint pt2, const long64 currentY)
{
  //preconditions: pt1.Y <> pt2.Y and pt1.Y > pt2.Y
  if (currentY >= pt1.Y) return pt1.X;
  else if (currentY == pt2.Y) return pt2.X;
  else if (pt1.X == pt2.X) return pt1.X;
  else
  {
    double q = (double)(pt1.X-pt2.X)/(double)(pt1.Y-pt2.Y);
    return Round(pt1.X + (currentY - pt1.Y) *q);
  }
}